

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O2

map_iterator map_iterator_begin(map m)

{
  map_iterator it;
  
  if ((((m != (map)0x0) && (m->buckets != (bucket)0x0)) && (m->count != 0)) &&
     (it = (map_iterator)malloc(0x18), it != (map_iterator)0x0)) {
    it->m = m;
    it->current_bucket = 0;
    it->current_pair = 0;
    map_iterator_next(it);
    return it;
  }
  return (map_iterator)0x0;
}

Assistant:

map_iterator map_iterator_begin(map m)
{
	if (m != NULL && m->buckets != NULL && map_size(m) > 0)
	{
		map_iterator it = malloc(sizeof(struct map_iterator_type));

		if (it != NULL)
		{
			it->m = m;
			it->current_bucket = 0;
			it->current_pair = 0;

			map_iterator_next(it);

			return it;
		}
	}

	return NULL;
}